

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

char * luaL_gsub(lua_State *L,char *s,char *p,char *r)

{
  char *pcVar1;
  undefined1 local_448 [8];
  luaL_Buffer b;
  char *r_local;
  char *p_local;
  char *s_local;
  lua_State *L_local;
  
  b.init._1016_8_ = r;
  luaL_buffinit(L,(luaL_Buffer *)local_448);
  luaL_addgsub((luaL_Buffer *)local_448,s,p,(char *)b.init._1016_8_);
  luaL_pushresult((luaL_Buffer *)local_448);
  pcVar1 = lua_tolstring(L,-1,(size_t *)0x0);
  return pcVar1;
}

Assistant:

LUALIB_API const char *luaL_gsub (lua_State *L, const char *s,
                                  const char *p, const char *r) {
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  luaL_addgsub(&b, s, p, r);
  luaL_pushresult(&b);
  return lua_tostring(L, -1);
}